

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O1

string * __thiscall
duckdb::CatalogSearchPath::GetDefaultCatalog
          (string *__return_storage_ptr__,CatalogSearchPath *this,string *schema)

{
  pointer pCVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  CatalogSearchEntry *path;
  pointer pCVar8;
  
  bVar3 = DefaultSchemaGenerator::IsDefaultSchema(schema);
  if (bVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "system";
    pcVar6 = "";
  }
  else {
    pCVar8 = (this->paths).
             super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (this->paths).
             super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
             super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = pCVar8 == pCVar1;
    if (!bVar3) {
      do {
        iVar5 = ::std::__cxx11::string::compare((char *)pCVar8);
        if (iVar5 == 0) {
          iVar5 = 3;
        }
        else {
          bVar4 = StringUtil::CIEquals(&pCVar8->schema,schema);
          iVar5 = 0;
          if (bVar4) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar2 = (pCVar8->catalog)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar2,
                       pcVar2 + (pCVar8->catalog)._M_string_length);
            iVar5 = 1;
          }
        }
        if ((iVar5 != 3) && (iVar5 != 0)) {
          if (!bVar3) {
            return __return_storage_ptr__;
          }
          break;
        }
        pCVar8 = pCVar8 + 1;
        bVar3 = pCVar8 == pCVar1;
      } while (!bVar3);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = anon_var_dwarf_63b5960 + 9;
    pcVar7 = anon_var_dwarf_63b5960 + 9;
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

string CatalogSearchPath::GetDefaultCatalog(const string &schema) const {
	if (DefaultSchemaGenerator::IsDefaultSchema(schema)) {
		return SYSTEM_CATALOG;
	}
	for (auto &path : paths) {
		if (path.catalog == TEMP_CATALOG) {
			continue;
		}
		if (StringUtil::CIEquals(path.schema, schema)) {
			return path.catalog;
		}
	}
	return INVALID_CATALOG;
}